

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_manager.cpp
# Opt level: O1

MangledEntryName *
duckdb::DependencyManager::MangleName(MangledEntryName *__return_storage_ptr__,CatalogEntry *entry)

{
  CatalogType CVar1;
  long lVar2;
  pointer pcVar3;
  int iVar4;
  undefined4 extraout_var;
  CatalogEntry *in_RDX;
  DependencyEntry *dependency_entry;
  string name;
  string schema;
  CatalogEntryInfo info;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  string local_90;
  undefined1 local_70 [8];
  _Alloc_hider local_68;
  char local_58 [16];
  _Alloc_hider local_48;
  char local_38 [16];
  
  CVar1 = entry->type;
  if (CVar1 == DEPENDENCY_ENTRY) {
    iVar4 = (*entry->_vptr_CatalogEntry[0x11])(entry);
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    lVar2 = *(long *)CONCAT44(extraout_var,iVar4);
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,lVar2,
               ((long *)CONCAT44(extraout_var,iVar4))[1] + lVar2);
  }
  else {
    GetSchema_abi_cxx11_(&local_90,(DependencyManager *)entry,in_RDX);
    pcVar3 = (entry->name)._M_dataplus._M_p;
    local_b0 = local_a0;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar3,pcVar3 + (entry->name)._M_string_length);
    local_70[0] = CVar1;
    local_68._M_p = local_58;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,local_90._M_dataplus._M_p,
               local_90._M_dataplus._M_p + local_90._M_string_length);
    local_48._M_p = local_38;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_48,local_b0,local_b0 + local_a8);
    MangledEntryName::MangledEntryName(__return_storage_ptr__,(CatalogEntryInfo *)local_70);
    if (local_48._M_p != local_38) {
      operator_delete(local_48._M_p);
    }
    if (local_68._M_p != local_58) {
      operator_delete(local_68._M_p);
    }
    if (local_b0 != local_a0) {
      operator_delete(local_b0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

MangledEntryName DependencyManager::MangleName(const CatalogEntry &entry) {
	if (entry.type == CatalogType::DEPENDENCY_ENTRY) {
		auto &dependency_entry = entry.Cast<DependencyEntry>();
		return dependency_entry.EntryMangledName();
	}
	auto type = entry.type;
	auto schema = GetSchema(entry);
	auto name = entry.name;
	CatalogEntryInfo info {type, schema, name};

	return MangleName(info);
}